

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::idchar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  byte bVar1;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> *poVar2;
  
  if ((this == (anon_unknown_10 *)0x0) ||
     ((((bVar1 = *(byte *)in._M_len, 9 < (byte)(bVar1 - 0x30) &&
        (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
       ((0x3f < bVar1 - 0x21 || ((0xe8000000fa00767dU >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)))
       ) && ((bVar1 != 0x7e && (bVar1 != 0x7c)))))) {
    poVar2 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
    _M_value.span._M_len = 1;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
    _M_value.span._M_str = (char *)in._M_len;
    poVar2 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)&DAT_00000001;
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged =
       SUB81(poVar2,0);
  return poVar2;
}

Assistant:

std::optional<LexResult> idchar(std::string_view in) {
  LexCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  uint8_t c = ctx.peek();
  if (('0' <= c && c <= '9') || ('A' <= c && c <= 'Z') ||
      ('a' <= c && c <= 'z')) {
    ctx.take(1);
  } else {
    switch (c) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
      case '-':
      case '.':
      case '/':
      case ':':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case '\\':
      case '^':
      case '_':
      case '`':
      case '|':
      case '~':
        ctx.take(1);
    }
  }
  return ctx.lexed();
}